

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::AnnotatedHandler::~AnnotatedHandler(AnnotatedHandler *this)

{
  kj::
  Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
  ::~Table(&(this->unionTagValues).table);
  kj::
  Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
  ::~Table(&(this->fieldsByName).table);
  kj::Array<capnp::JsonCodec::AnnotatedHandler::FieldInfo>::~Array(&this->fields);
  return;
}

Assistant:

class JsonCodec::AnnotatedHandler final: public JsonCodec::Handler<DynamicStruct> {
public:
  AnnotatedHandler(JsonCodec& codec, StructSchema schema,
                   kj::Maybe<json::DiscriminatorOptions::Reader> discriminator,
                   kj::Maybe<kj::StringPtr> unionDeclName,
                   kj::Vector<Schema>& dependencies)
      : schema(schema) {
    auto schemaProto = schema.getProto();
    auto typeName = schemaProto.getDisplayName();

    if (discriminator == kj::none) {
      // There are two cases of unions:
      // * Named unions, which are special cases of named groups. In this case, the union may be
      //   annotated by annotating the field. In this case, we receive a non-null `discriminator`
      //   as a constructor parameter, and schemaProto.getAnnotations() must be empty because
      //   it's not possible to annotate a group's type (because the type is anonymous).
      // * Unnamed unions, of which there can only be one in any particular scope. In this case,
      //   the parent struct type itself is annotated.
      // So if we received `null` as the constructor parameter, check for annotations on the struct
      // type.
      for (auto anno: schemaProto.getAnnotations()) {
        switch (anno.getId()) {
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            discriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
        }
      }
    }

    KJ_IF_SOME(d, discriminator) {
      if (d.hasName()) {
        unionTagName = d.getName();
      } else {
        unionTagName = unionDeclName;
      }
      KJ_IF_SOME(u, unionTagName) {
        fieldsByName.insert(u, FieldNameInfo {
          FieldNameInfo::UNION_TAG, 0, 0, nullptr
        });
      }

      if (d.hasValueName()) {
        fieldsByName.insert(d.getValueName(), FieldNameInfo {
          FieldNameInfo::UNION_VALUE, 0, 0, nullptr
        });
      }
    }

    discriminantOffset = schemaProto.getStruct().getDiscriminantOffset();

    fields = KJ_MAP(field, schema.getFields()) {
      auto fieldProto = field.getProto();
      auto type = field.getType();
      auto fieldName = fieldProto.getName();

      FieldNameInfo nameInfo;
      nameInfo.index = field.getIndex();
      nameInfo.type = FieldNameInfo::NORMAL;
      nameInfo.prefixLength = 0;

      FieldInfo info;
      info.name = fieldName;

      kj::Maybe<json::DiscriminatorOptions::Reader> subDiscriminator;
      bool flattened = false;
      for (auto anno: field.getProto().getAnnotations()) {
        switch (anno.getId()) {
          case JSON_NAME_ANNOTATION_ID:
            info.name = anno.getValue().getText();
            break;
          case JSON_FLATTEN_ANNOTATION_ID:
            KJ_REQUIRE(type.isStruct(), "only struct types can be flattened", fieldName, typeName);
            flattened = true;
            info.prefix = anno.getValue().getStruct().getAs<json::FlattenOptions>().getPrefix();
            break;
          case JSON_DISCRIMINATOR_ANNOTATION_ID:
            KJ_REQUIRE(fieldProto.isGroup(), "only unions can have discriminator");
            subDiscriminator = anno.getValue().getStruct().getAs<json::DiscriminatorOptions>();
            break;
          case JSON_BASE64_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for base64 encoding");
            static Base64Handler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
          case JSON_HEX_ANNOTATION_ID: {
            KJ_REQUIRE(field.getType().isData(), "only Data can be marked for hex encoding");
            static HexHandler handler;
            codec.addFieldHandler(field, handler);
            break;
          }
        }
      }

      if (fieldProto.isGroup()) {
        // Load group type handler now, even if not flattened, so that we can pass its
        // `subDiscriminator`.
        kj::Maybe<kj::StringPtr> subFieldName;
        if (flattened) {
          // If the group was flattened, then we allow its field name to be used as the
          // discriminator name, so that the discriminator doesn't have to explicitly specify a
          // name.
          subFieldName = fieldName;
        }
        auto& subHandler = codec.loadAnnotatedHandler(
            type.asStruct(), subDiscriminator, subFieldName, dependencies);
        if (flattened) {
          info.flattenHandler = subHandler;
        }
      } else if (type.isStruct()) {
        if (flattened) {
          info.flattenHandler = codec.loadAnnotatedHandler(
              type.asStruct(), kj::none, kj::none, dependencies);
        }
      }

      bool isUnionMember = fieldProto.getDiscriminantValue() != schema::Field::NO_DISCRIMINANT;

      KJ_IF_SOME(fh, info.flattenHandler) {
        // Set up fieldsByName for each of the child's fields.
        for (auto& entry: fh.fieldsByName) {
          kj::StringPtr flattenedName;
          kj::String ownName;
          if (info.prefix.size() > 0) {
            ownName = kj::str(info.prefix, entry.key);
            flattenedName = ownName;
          } else {
            flattenedName = entry.key;
          }

          fieldsByName.upsert(flattenedName, FieldNameInfo {
            isUnionMember ? FieldNameInfo::FLATTENED_FROM_UNION : FieldNameInfo::FLATTENED,
            field.getIndex(), (uint)info.prefix.size(), kj::mv(ownName)
          }, [&](FieldNameInfo& existing, FieldNameInfo&& replacement) {
            KJ_REQUIRE(existing.type == FieldNameInfo::FLATTENED_FROM_UNION &&
                       replacement.type == FieldNameInfo::FLATTENED_FROM_UNION,
                "flattened members have the same name and are not mutually exclusive");
          });
        }
      }

      info.nameForDiscriminant = info.name;

      if (!flattened) {
        bool isUnionWithValueName = false;
        if (isUnionMember) {
          KJ_IF_SOME(d, discriminator) {
            if (d.hasValueName()) {
              info.name = d.getValueName();
              isUnionWithValueName = true;
            }
          }
        }

        if (!isUnionWithValueName) {
          fieldsByName.insert(info.name, kj::mv(nameInfo));
        }
      }

      if (isUnionMember) {
        unionTagValues.insert(info.nameForDiscriminant, field);
      }

      // Look for dependencies that we need to add.
      while (type.isList()) type = type.asList().getElementType();
      if (codec.impl->typeHandlers.find(type) == kj::none) {
        switch (type.which()) {
          case schema::Type::STRUCT:
            dependencies.add(type.asStruct());
            break;
          case schema::Type::ENUM:
            dependencies.add(type.asEnum());
            break;
          case schema::Type::INTERFACE:
            dependencies.add(type.asInterface());
            break;
          default:
            break;
        }
      }

      return info;
    };
  }

  const StructSchema schema;

  void encode(const JsonCodec& codec, DynamicStruct::Reader input,
              JsonValue::Builder output) const override {
    kj::Vector<FlattenedField> flattenedFields;
    gatherForEncode(codec, input, nullptr, nullptr, flattenedFields);

    auto outs = output.initObject(flattenedFields.size());
    for (auto i: kj::indices(flattenedFields)) {
      auto& in = flattenedFields[i];
      auto out = outs[i];
      out.setName(in.name);
      KJ_SWITCH_ONEOF(in.type) {
        KJ_CASE_ONEOF(type, Type) {
          codec.encode(in.value, type, out.initValue());
        }
        KJ_CASE_ONEOF(field, StructSchema::Field) {
          codec.encodeField(field, in.value, out.initValue());
        }
      }
    }
  }

  void decode(const JsonCodec& codec, JsonValue::Reader input,
              DynamicStruct::Builder output) const override {
    KJ_REQUIRE(input.isObject());
    kj::HashSet<const void*> unionsSeen;
    kj::Vector<JsonValue::Field::Reader> retries;
    for (auto field: input.getObject()) {
      if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
        retries.add(field);
      }
    }
    while (!retries.empty()) {
      auto retriesCopy = kj::mv(retries);
      KJ_ASSERT(retries.empty());
      for (auto field: retriesCopy) {
        if (!decodeField(codec, field.getName(), field.getValue(), output, unionsSeen)) {
          retries.add(field);
        }
      }
      if (retries.size() == retriesCopy.size()) {
        // We made no progress in this iteration. Give up on the remaining fields.
        break;
      }
    }
  }

private:
  struct FieldInfo {
    kj::StringPtr name;
    kj::StringPtr nameForDiscriminant;
    kj::Maybe<const AnnotatedHandler&> flattenHandler;
    kj::StringPtr prefix;
  };

  kj::Array<FieldInfo> fields;
  // Maps field index -> info about the field

  struct FieldNameInfo {
    enum {
      NORMAL,
      // This is a normal field with the given `index`.

      FLATTENED,
      // This is a field of a flattened inner struct or group (that is not in a union). `index`
      // is the field index of the particular struct/group field.

      UNION_TAG,
      // The parent struct is a flattened union, and this field is the discriminant tag. It is a
      // string field whose name determines the union type. `index` is not used.

      FLATTENED_FROM_UNION,
      // The parent struct is a flattened union, and some of the union's members are flattened
      // structs or groups, and this field is possibly a member of one or more of them. `index`
      // is not used, because it's possible that the same field name appears in multiple variants.
      // Instead, the parser must find the union tag, and then can descend and attempt to parse
      // the field in the context of whichever variant is selected.

      UNION_VALUE
      // This field is the value of a discriminated union that has `valueName` set.
    } type;

    uint index;
    // For `NORMAL` and `FLATTENED`, the index of the field in schema.getFields().

    uint prefixLength;
    kj::String ownName;
  };

  kj::HashMap<kj::StringPtr, FieldNameInfo> fieldsByName;
  // Maps JSON names to info needed to parse them.

  kj::HashMap<kj::StringPtr, StructSchema::Field> unionTagValues;
  // If the parent struct is a flattened union, it has a tag field which is a string with one of
  // these values. The map maps to the union member to set.

  kj::Maybe<kj::StringPtr> unionTagName;
  // If the parent struct is a flattened union, the name of the "tag" field.

  uint discriminantOffset;
  // Shortcut for schema.getProto().getStruct().getDiscriminantOffset(), used in a hack to identify
  // which unions have been seen.

  struct FlattenedField {
    kj::String ownName;
    kj::StringPtr name;
    kj::OneOf<StructSchema::Field, Type> type;
    DynamicValue::Reader value;

    FlattenedField(kj::StringPtr prefix, kj::StringPtr name,
                   kj::OneOf<StructSchema::Field, Type> type, DynamicValue::Reader value)
        : ownName(prefix.size() > 0 ? kj::str(prefix, name) : nullptr),
          name(prefix.size() > 0 ? ownName : name),
          type(type), value(value) {}
  };

  void gatherForEncode(const JsonCodec& codec, DynamicValue::Reader input,
                       kj::StringPtr prefix, kj::StringPtr morePrefix,
                       kj::Vector<FlattenedField>& flattenedFields) const {
    kj::String ownPrefix;
    if (morePrefix.size() > 0) {
      if (prefix.size() > 0) {
        ownPrefix = kj::str(prefix, morePrefix);
        prefix = ownPrefix;
      } else {
        prefix = morePrefix;
      }
    }

    auto reader = input.as<DynamicStruct>();
    auto schema = reader.getSchema();
    for (auto field: schema.getNonUnionFields()) {
      auto& info = fields[field.getIndex()];
      if (!reader.has(field, codec.impl->hasMode)) {
        // skip
      } else KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(field), prefix, info.prefix, flattenedFields);
      } else {
        flattenedFields.add(FlattenedField {
            prefix, info.name, field, reader.get(field) });
      }
    }

    KJ_IF_SOME(which, reader.which()) {
      auto& info = fields[which.getIndex()];
      KJ_IF_SOME(tag, unionTagName) {
        flattenedFields.add(FlattenedField {
            prefix, tag, Type(schema::Type::TEXT), Text::Reader(info.nameForDiscriminant) });
      }

      KJ_IF_SOME(handler, info.flattenHandler) {
        handler.gatherForEncode(codec, reader.get(which), prefix, info.prefix, flattenedFields);
      } else {
        auto type = which.getType();
        if (type.which() == schema::Type::VOID && unionTagName != kj::none) {
          // When we have an explicit union discriminant, we don't need to encode void fields.
        } else {
          flattenedFields.add(FlattenedField {
              prefix, info.name, which, reader.get(which) });
        }
      }
    }
  }

  bool decodeField(const JsonCodec& codec, kj::StringPtr name, JsonValue::Reader value,
                   DynamicStruct::Builder output, kj::HashSet<const void*>& unionsSeen) const {
    KJ_ASSERT(output.getSchema() == schema);

    KJ_IF_SOME(info, fieldsByName.find(name)) {
      switch (info.type) {
        case FieldNameInfo::NORMAL: {
          auto field = output.getSchema().getFields()[info.index];
          codec.decodeField(field, value, Orphanage::getForMessageContaining(output), output);
          return true;
        }
        case FieldNameInfo::FLATTENED:
          return KJ_ASSERT_NONNULL(fields[info.index].flattenHandler)
              .decodeField(codec, name.slice(info.prefixLength), value,
                  output.get(output.getSchema().getFields()[info.index]).as<DynamicStruct>(),
                  unionsSeen);
        case FieldNameInfo::UNION_TAG: {
          KJ_REQUIRE(value.isString(), "Expected string value.");

          // Mark that we've seen a union tag for this struct.
          const void* ptr = getUnionInstanceIdentifier(output);
          KJ_IF_SOME(field, unionTagValues.find(value.getString())) {
            // clear() has the side-effect of activating this member of the union, without
            // allocating any objects.
            output.clear(field);
            unionsSeen.insert(ptr);
          }
          return true;
        }
        case FieldNameInfo::FLATTENED_FROM_UNION: {
          const void* ptr = getUnionInstanceIdentifier(output);
          if (unionsSeen.contains(ptr)) {
            auto variant = KJ_ASSERT_NONNULL(output.which());
            return KJ_ASSERT_NONNULL(fields[variant.getIndex()].flattenHandler)
                .decodeField(codec, name.slice(info.prefixLength), value,
                    output.get(variant).as<DynamicStruct>(), unionsSeen);
          } else {
            // We haven't seen the union tag yet, so we can't parse this field yet. Try again later.
            return false;
          }
        }
        case FieldNameInfo::UNION_VALUE: {
          const void* ptr = getUnionInstanceIdentifier(output);
          if (unionsSeen.contains(ptr)) {
            auto variant = KJ_ASSERT_NONNULL(output.which());
            codec.decodeField(variant, value, Orphanage::getForMessageContaining(output), output);
            return true;
          } else {
            // We haven't seen the union tag yet, so we can't parse this field yet. Try again later.
            return false;
          }
        }
      }

      KJ_UNREACHABLE;
    } else {
      // Ignore undefined field -- unless the flag is set to reject them.
      KJ_REQUIRE(!codec.impl->rejectUnknownFields, "Unknown field", name);
      return true;
    }